

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O0

char * NewtJoinPath(char *s1,char *s2,char sep)

{
  size_t sVar1;
  size_t sVar2;
  uint32_t len2;
  uint32_t len1;
  uint32_t len;
  char *path;
  char sep_local;
  char *s2_local;
  char *s1_local;
  
  sVar1 = strlen(s1);
  sVar2 = strlen(s2);
  s1_local = (char *)malloc((ulong)((int)sVar1 + (int)sVar2 + 2));
  if (s1_local == (char *)0x0) {
    s1_local = (char *)0x0;
  }
  else {
    strcpy(s1_local,s1);
    s1_local[sVar1 & 0xffffffff] = sep;
    strncpy(s1_local + (sVar1 & 0xffffffff) + 1,s2,(ulong)((int)sVar2 + 1));
  }
  return s1_local;
}

Assistant:

char * NewtJoinPath(char * s1, char * s2, char sep)
{
    char *		path;
    uint32_t	len;
    uint32_t	len1;
    uint32_t	len2;
    
    len1 = (uint32_t)strlen(s1);
    len2 = (uint32_t)strlen(s2);
    
    len = len1 + len2 + 2;
    
    path = malloc(len);
    if (path == NULL) return NULL;
    
    strcpy(path, s1);
    
    path[len1] = sep;
    strncpy(path + len1 + 1, s2, len2 + 1);
    
    return path;
}